

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void __thiscall Search::predictor::predictor(predictor *this,search *sch,ptag my_tag)

{
  this->is_ldf = false;
  this->my_tag = my_tag;
  this->ec = (example *)0x0;
  this->ec_cnt = 0;
  this->ec_alloced = false;
  this->weight = 1.0;
  this->oracle_is_pointer = false;
  this->allowed_is_pointer = false;
  this->allowed_cost_is_pointer = false;
  this->learner_id = 0;
  this->sch = sch;
  (this->oracle_actions)._begin = (uint *)0x0;
  (this->oracle_actions)._end = (uint *)0x0;
  (this->oracle_actions).end_array = (uint *)0x0;
  (this->oracle_actions).erase_count = 0;
  (this->condition_on_tags)._begin = (uint *)0x0;
  (this->condition_on_tags)._end = (uint *)0x0;
  (this->condition_on_tags).end_array = (uint *)0x0;
  (this->condition_on_tags).erase_count = 0;
  (this->condition_on_names)._begin = (char *)0x0;
  (this->condition_on_names)._end = (char *)0x0;
  (this->condition_on_names).end_array = (char *)0x0;
  (this->condition_on_names).erase_count = 0;
  (this->allowed_actions).end_array = (uint *)0x0;
  (this->allowed_actions).erase_count = 0;
  (this->allowed_actions)._begin = (uint *)0x0;
  (this->allowed_actions)._end = (uint *)0x0;
  (this->allowed_actions_cost).end_array = (float *)0x0;
  (this->allowed_actions_cost).erase_count = 0;
  (this->allowed_actions_cost)._begin = (float *)0x0;
  (this->allowed_actions_cost)._end = (float *)0x0;
  return;
}

Assistant:

predictor::predictor(search& sch, ptag my_tag)
    : is_ldf(false)
    , my_tag(my_tag)
    , ec(nullptr)
    , ec_cnt(0)
    , ec_alloced(false)
    , weight(1.)
    , oracle_is_pointer(false)
    , allowed_is_pointer(false)
    , allowed_cost_is_pointer(false)
    , learner_id(0)
    , sch(sch)
{
  oracle_actions = v_init<action>();
  condition_on_tags = v_init<ptag>();
  condition_on_names = v_init<char>();
  allowed_actions = v_init<action>();
  allowed_actions_cost = v_init<float>();
}